

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

bool __thiscall
Assimp::FBX::FBXConverter::GenerateTransformationNodeChain
          (FBXConverter *this,Model *model,string *name,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *output_nodes,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *post_output_nodes)

{
  pointer *pppaVar1;
  FBXConverter *pFVar2;
  char *pcVar3;
  PropertyTable *this_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  RotOrder mode;
  long lVar18;
  Property *pPVar19;
  iterator iVar20;
  aiMatrix4x4t<float> *paVar21;
  aiNode *paVar22;
  int iVar23;
  string *psVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  _Rb_tree_color _Var29;
  iterator iVar30;
  FBXConverter *pFVar31;
  vector<aiNode*,std::allocator<aiNode*>> *this_01;
  undefined8 *puVar32;
  _Rb_tree_color _Var33;
  _Rb_tree_color _Var34;
  size_t i;
  ulong uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  aiNode *nd_1;
  aiNode *nd;
  undefined1 local_658 [32];
  vector<aiNode*,std::allocator<aiNode*>> *local_638;
  aiVector3D local_630;
  aiVector3D local_620;
  aiVector3D local_610;
  aiVector3D local_600;
  undefined1 local_5f0 [112];
  ios_base local_580 [216];
  float afStack_4a8 [12];
  undefined1 local_478 [4];
  undefined8 uStack_474;
  float afStack_46c [3];
  __node_base_ptr ap_Stack_460 [2];
  float local_450;
  undefined8 local_44c [2];
  char local_43c [4];
  aiMatrix4x4t<float> local_438;
  undefined4 local_3f8;
  undefined1 local_3f4 [16];
  undefined4 local_3e4;
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  float local_3cc;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  undefined8 local_3b4;
  ulong uStack_3ac;
  undefined4 local_3a4;
  long local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  float local_38c;
  undefined8 local_388;
  undefined8 local_380;
  undefined4 local_378;
  undefined8 local_374;
  ulong uStack_36c;
  undefined4 local_364;
  long local_360;
  undefined8 uStack_358;
  undefined4 local_350;
  float local_34c;
  undefined8 local_348;
  undefined8 local_340;
  undefined4 local_338;
  undefined1 local_334 [16];
  undefined4 local_324;
  undefined1 local_320 [16];
  undefined4 local_310;
  float local_30c;
  undefined8 local_308;
  undefined8 local_300;
  aiMatrix4x4 local_2f8;
  aiMatrix4x4 local_2b8;
  aiMatrix4x4 local_278;
  undefined4 local_238;
  undefined1 local_234 [16];
  undefined4 local_224;
  undefined1 local_220 [16];
  undefined4 local_210;
  float local_20c;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1f4;
  ulong uStack_1ec;
  undefined4 local_1e4;
  long local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  float local_1cc;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b4 [16];
  undefined4 local_1a4;
  undefined1 local_1a0 [16];
  undefined4 local_190;
  float local_18c;
  undefined8 local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_174;
  undefined8 uStack_16c;
  float local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  undefined8 local_14c;
  undefined8 uStack_144;
  undefined4 local_13c;
  undefined4 local_138;
  undefined1 local_134 [16];
  undefined4 local_124;
  undefined1 local_120 [16];
  undefined4 local_110;
  float local_10c;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined1 local_f4 [16];
  undefined4 local_e4;
  undefined1 local_e0 [16];
  undefined4 local_d0;
  float local_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  aiMatrix4x4 local_b8;
  float local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  float local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  
  this_00 = (model->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (PropertyTable *)0x0) {
    __assert_fail("props.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                  ,0x1b4,"const PropertyTable &Assimp::FBX::Model::Props() const");
  }
  mode = Model::RotationOrder(model);
  lVar18 = 0;
  do {
    *(undefined4 *)(local_478 + lVar18) = 0x3f800000;
    *(undefined8 *)((long)&uStack_474 + lVar18) = 0;
    *(undefined8 *)((long)afStack_46c + lVar18) = 0;
    *(undefined4 *)((long)afStack_46c + lVar18 + 8) = 0x3f800000;
    *(undefined8 *)((long)ap_Stack_460 + lVar18) = 0;
    *(undefined8 *)((long)ap_Stack_460 + lVar18 + 8) = 0;
    *(undefined4 *)((long)&local_450 + lVar18) = 0x3f800000;
    *(undefined8 *)((long)local_44c + lVar18) = 0;
    *(undefined8 *)((long)local_44c + lVar18 + 8) = 0;
    pcVar3 = local_43c + lVar18;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = -0x80;
    pcVar3[3] = '?';
    lVar18 = lVar18 + 0x40;
  } while (lVar18 != 0x440);
  lVar18 = 0;
  do {
    *(undefined4 *)(local_478 + lVar18) = 0x3f800000;
    *(undefined8 *)((long)&uStack_474 + lVar18) = 0;
    *(undefined8 *)((long)afStack_46c + lVar18) = 0;
    *(undefined4 *)((long)afStack_46c + lVar18 + 8) = 0x3f800000;
    *(undefined8 *)((long)ap_Stack_460 + lVar18) = 0;
    *(undefined8 *)((long)ap_Stack_460 + lVar18 + 8) = 0;
    *(undefined4 *)((long)&local_450 + lVar18) = 0x3f800000;
    *(undefined8 *)((long)local_44c + lVar18) = 0;
    *(undefined8 *)((long)local_44c + lVar18 + 8) = 0;
    pcVar3 = local_43c + lVar18;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = -0x80;
    pcVar3[3] = '?';
    lVar18 = lVar18 + 0x40;
  } while (lVar18 != 0x440);
  pFVar2 = (FBXConverter *)(local_5f0 + 0x10);
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"PreRotation","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar44 = 0.0;
  local_638 = (vector<aiNode*,std::allocator<aiNode*>> *)post_output_nodes;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
    uVar25._0_4_ = 0.0;
    uVar25._4_4_ = 0.0;
  }
  else {
    uVar25._0_4_ = 0.0;
    uVar25._4_4_ = 0.0;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      bVar17 = false;
      fVar44 = 0.0;
    }
    else {
      uVar25 = *(undefined8 *)(lVar18 + 8);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  pFVar31 = (FBXConverter *)local_5f0._0_8_;
  local_600._0_8_ = uVar25;
  local_600.z = fVar44;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  _Var33 = _S_red;
  if ((bVar17) &&
     (_Var33 = _S_red,
     1.1920929e-07 <
     fVar44 * fVar44 + (float)uVar25 * (float)uVar25 + SUB84(uVar25,4) * SUB84(uVar25,4))) {
    GetRotationMatrix(pFVar31,RotOrder_EulerXYZ,&local_600,&local_2f8);
    _Var33 = 0x40;
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"PostRotation","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
    uVar26._0_4_ = 0.0;
    uVar26._4_4_ = 0.0;
  }
  else {
    uVar26._0_4_ = 0.0;
    uVar26._4_4_ = 0.0;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      bVar17 = false;
      fVar44 = 0.0;
    }
    else {
      uVar26 = *(undefined8 *)(lVar18 + 8);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  pFVar31 = (FBXConverter *)local_5f0._0_8_;
  local_610._0_8_ = uVar26;
  local_610.z = fVar44;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) &&
     (1.1920929e-07 <
      fVar44 * fVar44 + (float)uVar26 * (float)uVar26 + SUB84(uVar26,4) * SUB84(uVar26,4))) {
    _Var33 = _Var33 | 0x100;
    GetRotationMatrix(pFVar31,RotOrder_EulerXYZ,&local_610,&local_278);
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"RotationPivot","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) && (1.1920929e-07 < fVar44 * fVar44 + fVar50 * fVar50 + fVar51 * fVar51)) {
    _Var33 = _Var33 | 0x220;
    local_338 = 0x3f800000;
    local_324 = 0x3f800000;
    local_310 = 0x3f800000;
    local_300 = 0x3f80000000000000;
    local_308 = 0;
    local_334 = ZEXT416((uint)fVar50) << 0x40;
    local_320 = ZEXT416((uint)fVar51) << 0x20;
    local_20c = -fVar44;
    local_238 = 0x3f800000;
    local_224 = 0x3f800000;
    local_210 = 0x3f800000;
    local_200 = 0x3f80000000000000;
    local_208 = 0;
    local_234 = ZEXT416((uint)-fVar50) << 0x40;
    local_220._0_8_ = (ulong)(uint)fVar51 << 0x20 ^ 0x8000000000000000;
    local_220._8_8_ = 0;
    local_30c = fVar44;
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"RotationOffset","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) && (1.1920929e-07 < fVar44 * fVar44 + fVar50 * fVar50 + fVar51 * fVar51)) {
    _Var33 = _Var33 | 0x10;
    local_378 = 0x3f800000;
    local_374 = 0;
    local_364 = 0x3f800000;
    uStack_358 = 0;
    local_350 = 0x3f800000;
    local_340 = 0x3f80000000000000;
    local_348 = 0;
    uStack_36c = (ulong)(uint)fVar50;
    local_360 = (ulong)(uint)fVar51 << 0x20;
    local_34c = fVar44;
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"ScalingOffset","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) && (1.1920929e-07 < fVar44 * fVar44 + fVar50 * fVar50 + fVar51 * fVar51)) {
    _Var33 = _Var33 | 0x400;
    local_1f8 = 0x3f800000;
    local_1f4 = 0;
    local_1e4 = 0x3f800000;
    uStack_1d8 = 0;
    local_1d0 = 0x3f800000;
    local_1c0 = 0x3f80000000000000;
    local_1c8 = 0;
    uStack_1ec = (ulong)(uint)fVar50;
    local_1e0 = (ulong)(uint)fVar51 << 0x20;
    local_1cc = fVar44;
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"ScalingPivot","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) && (1.1920929e-07 < fVar44 * fVar44 + fVar50 * fVar50 + fVar51 * fVar51)) {
    _Var33 = _Var33 | 0x2800;
    local_1b8 = 0x3f800000;
    local_1a4 = 0x3f800000;
    local_190 = 0x3f800000;
    local_180 = 0x3f80000000000000;
    local_188 = 0;
    local_1b4 = ZEXT416((uint)fVar50) << 0x40;
    local_1a0 = ZEXT416((uint)fVar51) << 0x20;
    local_10c = -fVar44;
    local_138 = 0x3f800000;
    local_124 = 0x3f800000;
    local_110 = 0x3f800000;
    local_100 = 0x3f80000000000000;
    local_108 = 0;
    local_134 = ZEXT416((uint)-fVar50) << 0x40;
    local_120._0_8_ = (ulong)(uint)fVar51 << 0x20 ^ 0x8000000000000000;
    local_120._8_8_ = 0;
    local_18c = fVar44;
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"Lcl Translation","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) && (1.1920929e-07 < fVar44 * fVar44 + fVar50 * fVar50 + fVar51 * fVar51)) {
    _Var33 = _Var33 | 8;
    local_3b8 = 0x3f800000;
    local_3b4 = 0;
    local_3a4 = 0x3f800000;
    uStack_398 = 0;
    local_390 = 0x3f800000;
    local_380 = 0x3f80000000000000;
    local_388 = 0;
    uStack_3ac = (ulong)(uint)fVar50;
    local_3a0 = (ulong)(uint)fVar51 << 0x20;
    local_38c = fVar44;
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"Lcl Scaling","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) &&
     (1.1920929e-07 <
      (fVar44 + -1.0) * (fVar44 + -1.0) +
      (fVar50 + -1.0) * (fVar50 + -1.0) + (fVar51 + -1.0) * (fVar51 + -1.0))) {
    _Var33 = _Var33 | 0x1000;
    local_174 = 0;
    uStack_16c = 0;
    local_160 = 0;
    uStack_158 = 0;
    local_14c = 0;
    uStack_144 = 0;
    local_13c = 0x3f800000;
    local_178 = fVar50;
    local_164 = fVar51;
    local_150 = fVar44;
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"Lcl Rotation","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
    uVar27._0_4_ = 0.0;
    uVar27._4_4_ = 0.0;
  }
  else {
    uVar27._0_4_ = 0.0;
    uVar27._4_4_ = 0.0;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      bVar17 = false;
      fVar44 = 0.0;
    }
    else {
      uVar27 = *(undefined8 *)(lVar18 + 8);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  pFVar31 = (FBXConverter *)local_5f0._0_8_;
  local_620._0_8_ = uVar27;
  local_620.z = fVar44;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) &&
     (1.1920929e-07 <
      fVar44 * fVar44 + (float)uVar27 * (float)uVar27 + SUB84(uVar27,4) * SUB84(uVar27,4))) {
    _Var33 = _Var33 | 0x80;
    GetRotationMatrix(pFVar31,mode,&local_620,&local_2b8);
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"GeometricScaling","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo)
    ;
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  _Var34 = _Var33;
  if ((bVar17) &&
     (1.1920929e-07 <
      (fVar44 + -1.0) * (fVar44 + -1.0) +
      (fVar50 + -1.0) * (fVar50 + -1.0) + (fVar51 + -1.0) * (fVar51 + -1.0))) {
    _Var34 = _Var33 + 0x10000;
    local_74 = 0;
    uStack_6c = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_4c = 0;
    uStack_44 = 0;
    local_3c = 0x3f800000;
    local_5f0._0_4_ = fVar50;
    local_658._0_4_ = fVar51;
    iVar23 = 0;
    while( true ) {
      fVar45 = fVar44;
      if ((iVar23 != 2) && (fVar45 = (float)local_5f0._0_4_, iVar23 == 1)) {
        fVar45 = (float)local_658._0_4_;
      }
      local_78 = fVar50;
      local_64 = fVar51;
      local_50 = fVar44;
      if (ABS(fVar45) <= 1.1920929e-07) {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x16e5c3);
        goto LAB_0016e626;
      }
      psVar24 = (string *)local_658;
      fVar45 = fVar51;
      if ((iVar23 != 1) && (psVar24 = (string *)local_5f0, fVar45 = fVar50, iVar23 == 2)) break;
      *(float *)&(psVar24->_M_dataplus)._M_p = 1.0 / fVar45;
      iVar23 = iVar23 + 1;
    }
    local_450 = 1.0 / fVar44;
    _Var34 = _Var33 | 0x10001;
    uStack_474 = 0;
    afStack_46c[0] = 0.0;
    afStack_46c[1] = 0.0;
    ap_Stack_460[0] = (__node_base_ptr)0x0;
    ap_Stack_460[1] = (__node_base_ptr)0x0;
    local_44c[0] = 0;
    local_44c[1] = 0;
    local_43c[0] = '\0';
    local_43c[1] = '\0';
    local_43c[2] = -0x80;
    local_43c[3] = '?';
    local_478 = (undefined1  [4])local_5f0._0_4_;
    afStack_46c[2] = (float)local_658._0_4_;
  }
LAB_0016e626:
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"GeometricRotation","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
    uVar28._0_4_ = 0.0;
    uVar28._4_4_ = 0.0;
  }
  else {
    uVar28._0_4_ = 0.0;
    uVar28._4_4_ = 0.0;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar18 == 0) {
      bVar17 = false;
      fVar44 = 0.0;
    }
    else {
      uVar28 = *(undefined8 *)(lVar18 + 8);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  pFVar31 = (FBXConverter *)local_5f0._0_8_;
  local_630._0_8_ = uVar28;
  local_630.z = fVar44;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) &&
     (1.1920929e-07 <
      fVar44 * fVar44 + (float)uVar28 * (float)uVar28 + SUB84(uVar28,4) * SUB84(uVar28,4))) {
    _Var34 = _Var34 | 0x8002;
    GetRotationMatrix(pFVar31,mode,&local_630,&local_b8);
    GetRotationMatrix(pFVar31,mode,&local_630,&local_438);
    aiMatrix4x4t<float>::Inverse(&local_438);
  }
  local_5f0._0_8_ = pFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"GeometricTranslation","");
  pPVar19 = PropertyTable::Get(this_00,(string *)local_5f0);
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar44 = 0.0;
  if (pPVar19 == (Property *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    lVar18 = __dynamic_cast(pPVar19,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                            0);
    if (lVar18 == 0) {
      fVar44 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
    }
    else {
      fVar50 = (float)*(undefined8 *)(lVar18 + 8);
      fVar51 = (float)((ulong)*(undefined8 *)(lVar18 + 8) >> 0x20);
      fVar44 = *(float *)(lVar18 + 0x10);
      bVar17 = true;
    }
  }
  pFVar31 = (FBXConverter *)local_5f0._0_8_;
  if ((FBXConverter *)local_5f0._0_8_ != pFVar2) {
    operator_delete((void *)local_5f0._0_8_);
  }
  if ((bVar17) && (1.1920929e-07 < fVar44 * fVar44 + fVar50 * fVar50 + fVar51 * fVar51)) {
    _Var34 = _Var34 | 0x4004;
    local_f8 = 0x3f800000;
    local_e4 = 0x3f800000;
    local_d0 = 0x3f800000;
    local_c0 = 0x3f80000000000000;
    local_c8 = 0;
    local_f4 = ZEXT416((uint)fVar50) << 0x40;
    local_e0 = ZEXT416((uint)fVar51) << 0x20;
    local_3cc = -fVar44;
    local_3f8 = 0x3f800000;
    local_3e4 = 0x3f800000;
    local_3d0 = 0x3f800000;
    local_3c0 = 0x3f80000000000000;
    local_3c8 = 0;
    local_3f4 = ZEXT416((uint)-fVar50) << 0x40;
    local_3e0._0_8_ = (ulong)(uint)fVar51 << 0x20 ^ 0x8000000000000000;
    local_3e0._8_8_ = 0;
    local_cc = fVar44;
  }
  bVar17 = NeedsComplexTransformationChain(pFVar31,model);
  if (bVar17 != ((_Var34 & 0x1ef77) != _S_red)) {
    __assert_fail("NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x326,
                  "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if (((_Var34 & 0x1ef77) == _S_red) || (this->doc->settings->preservePivots != true)) {
    paVar22 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar22);
    iVar30._M_current =
         (output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_5f0._0_8_ = paVar22;
    if (iVar30._M_current ==
        (output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                ((vector<aiNode*,std::allocator<aiNode*>> *)output_nodes,iVar30,(aiNode **)local_5f0
                );
    }
    else {
      *iVar30._M_current = paVar22;
      pppaVar1 = &(output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    uVar25 = local_5f0._0_8_;
    uVar35 = name->_M_string_length;
    if (uVar35 < 0x400) {
      *(int *)local_5f0._0_8_ = (int)uVar35;
      memcpy((char *)(local_5f0._0_8_ + 4),(name->_M_dataplus)._M_p,uVar35);
      *(char *)(uVar25 + uVar35 + 4) = '\0';
    }
    fVar36 = (((aiNode *)local_5f0._0_8_)->mTransformation).a1;
    fVar37 = (((aiNode *)local_5f0._0_8_)->mTransformation).a2;
    fVar38 = (((aiNode *)local_5f0._0_8_)->mTransformation).a3;
    fVar39 = (((aiNode *)local_5f0._0_8_)->mTransformation).a4;
    fVar40 = (((aiNode *)local_5f0._0_8_)->mTransformation).b1;
    fVar41 = (((aiNode *)local_5f0._0_8_)->mTransformation).b2;
    fVar42 = (((aiNode *)local_5f0._0_8_)->mTransformation).b3;
    fVar43 = (((aiNode *)local_5f0._0_8_)->mTransformation).b4;
    fVar44 = (((aiNode *)local_5f0._0_8_)->mTransformation).c1;
    fVar50 = (((aiNode *)local_5f0._0_8_)->mTransformation).c2;
    fVar51 = (((aiNode *)local_5f0._0_8_)->mTransformation).c3;
    fVar45 = (((aiNode *)local_5f0._0_8_)->mTransformation).c4;
    fVar46 = (((aiNode *)local_5f0._0_8_)->mTransformation).d1;
    fVar47 = (((aiNode *)local_5f0._0_8_)->mTransformation).d2;
    fVar48 = (((aiNode *)local_5f0._0_8_)->mTransformation).d3;
    fVar49 = (((aiNode *)local_5f0._0_8_)->mTransformation).d4;
    lVar18 = 0x30;
    do {
      fVar4 = *(float *)((long)afStack_4a8 + lVar18);
      fVar53 = *(float *)((long)afStack_4a8 + lVar18 + 4);
      fVar54 = *(float *)((long)afStack_4a8 + lVar18 + 8);
      fVar55 = *(float *)((long)afStack_4a8 + lVar18 + 0xc);
      fVar5 = *(float *)((long)afStack_4a8 + lVar18 + 0x10);
      fVar6 = *(float *)((long)afStack_4a8 + lVar18 + 0x14);
      fVar57 = *(float *)((long)afStack_4a8 + lVar18 + 0x18);
      fVar60 = *(float *)((long)afStack_4a8 + lVar18 + 0x1c);
      fVar7 = *(float *)((long)afStack_4a8 + lVar18 + 0x20);
      fVar8 = *(float *)((long)afStack_4a8 + lVar18 + 0x24);
      fVar9 = *(float *)((long)afStack_4a8 + lVar18 + 0x28);
      fVar52 = *(float *)((long)afStack_4a8 + lVar18 + 0x2c);
      fVar10 = *(float *)(local_478 + lVar18);
      fVar11 = *(float *)((long)&uStack_474 + lVar18);
      fVar12 = *(float *)((long)&uStack_474 + lVar18 + 4);
      fVar13 = *(float *)((long)afStack_46c + lVar18);
      fVar56 = fVar37 * fVar57;
      fVar58 = fVar37 * fVar60;
      fVar61 = fVar36 * fVar53;
      fVar62 = fVar36 * fVar54;
      fVar63 = fVar36 * fVar55;
      fVar59 = fVar38 * fVar52;
      fVar36 = fVar39 * fVar10 + fVar38 * fVar7 + fVar36 * fVar4 + fVar37 * fVar5;
      fVar37 = fVar39 * fVar11 + fVar38 * fVar8 + fVar61 + fVar37 * fVar6;
      fVar38 = fVar39 * fVar12 + fVar38 * fVar9 + fVar62 + fVar56;
      fVar39 = fVar39 * fVar13 + fVar59 + fVar63 + fVar58;
      (((aiNode *)local_5f0._0_8_)->mTransformation).a1 = fVar36;
      (((aiNode *)local_5f0._0_8_)->mTransformation).a2 = fVar37;
      (((aiNode *)local_5f0._0_8_)->mTransformation).a3 = fVar38;
      (((aiNode *)local_5f0._0_8_)->mTransformation).a4 = fVar39;
      fVar56 = fVar41 * fVar57;
      fVar58 = fVar41 * fVar60;
      fVar61 = fVar40 * fVar53;
      fVar62 = fVar40 * fVar54;
      fVar63 = fVar40 * fVar55;
      fVar59 = fVar42 * fVar52;
      fVar40 = fVar43 * fVar10 + fVar42 * fVar7 + fVar40 * fVar4 + fVar41 * fVar5;
      fVar41 = fVar43 * fVar11 + fVar42 * fVar8 + fVar61 + fVar41 * fVar6;
      fVar42 = fVar43 * fVar12 + fVar42 * fVar9 + fVar62 + fVar56;
      fVar43 = fVar43 * fVar13 + fVar59 + fVar63 + fVar58;
      (((aiNode *)local_5f0._0_8_)->mTransformation).b1 = fVar40;
      (((aiNode *)local_5f0._0_8_)->mTransformation).b2 = fVar41;
      (((aiNode *)local_5f0._0_8_)->mTransformation).b3 = fVar42;
      (((aiNode *)local_5f0._0_8_)->mTransformation).b4 = fVar43;
      fVar56 = fVar50 * fVar57;
      fVar58 = fVar50 * fVar60;
      fVar61 = fVar44 * fVar53;
      fVar62 = fVar44 * fVar54;
      fVar63 = fVar44 * fVar55;
      fVar59 = fVar51 * fVar52;
      fVar44 = fVar45 * fVar10 + fVar51 * fVar7 + fVar44 * fVar4 + fVar50 * fVar5;
      fVar50 = fVar45 * fVar11 + fVar51 * fVar8 + fVar61 + fVar50 * fVar6;
      fVar51 = fVar45 * fVar12 + fVar51 * fVar9 + fVar62 + fVar56;
      fVar45 = fVar45 * fVar13 + fVar59 + fVar63 + fVar58;
      (((aiNode *)local_5f0._0_8_)->mTransformation).c1 = fVar44;
      (((aiNode *)local_5f0._0_8_)->mTransformation).c2 = fVar50;
      (((aiNode *)local_5f0._0_8_)->mTransformation).c3 = fVar51;
      (((aiNode *)local_5f0._0_8_)->mTransformation).c4 = fVar45;
      fVar57 = fVar47 * fVar57;
      fVar60 = fVar47 * fVar60;
      fVar53 = fVar46 * fVar53;
      fVar54 = fVar46 * fVar54;
      fVar55 = fVar46 * fVar55;
      fVar52 = fVar48 * fVar52;
      fVar46 = fVar49 * fVar10 + fVar48 * fVar7 + fVar46 * fVar4 + fVar47 * fVar5;
      fVar47 = fVar49 * fVar11 + fVar48 * fVar8 + fVar53 + fVar47 * fVar6;
      fVar48 = fVar49 * fVar12 + fVar48 * fVar9 + fVar54 + fVar57;
      fVar49 = fVar49 * fVar13 + fVar52 + fVar55 + fVar60;
      (((aiNode *)local_5f0._0_8_)->mTransformation).d1 = fVar46;
      (((aiNode *)local_5f0._0_8_)->mTransformation).d2 = fVar47;
      (((aiNode *)local_5f0._0_8_)->mTransformation).d3 = fVar48;
      (((aiNode *)local_5f0._0_8_)->mTransformation).d4 = fVar49;
      lVar18 = lVar18 + 0x40;
    } while (lVar18 != 0x470);
    bVar17 = false;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658,
                   "generating full transformation chain for node: ",name);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658);
    LogFunctions<Assimp::FBXImporter>::LogInfo((format *)local_5f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f0);
    std::ios_base::~ios_base(local_580);
    if ((aiNode *)local_658._0_8_ != (aiNode *)(local_658 + 0x10)) {
      operator_delete((void *)local_658._0_8_);
    }
    iVar30._M_current = (aiNode **)name;
    iVar20 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(&(this->node_anim_chain_bits)._M_t,name);
    if ((_Rb_tree_header *)iVar20._M_node ==
        &(this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header) {
      _Var33 = _S_red;
    }
    else {
      _Var33 = iVar20._M_node[2]._M_color;
    }
    _Var29 = _S_black;
    puVar32 = (undefined8 *)local_478;
    uVar35 = 0;
    do {
      if ((_Var29 & (_Var34 | _Var33)) != _S_red) {
        if (uVar35 == 8) {
          paVar21 = aiMatrix4x4t<float>::Inverse(&local_278);
          local_278.a1 = paVar21->a1;
          local_278.a2 = paVar21->a2;
          local_278.a3 = paVar21->a3;
          local_278.a4 = paVar21->a4;
          local_278.b1 = paVar21->b1;
          local_278.b2 = paVar21->b2;
          local_278.b3 = paVar21->b3;
          local_278.b4 = paVar21->b4;
          local_278.c1 = paVar21->c1;
          local_278.c2 = paVar21->c2;
          local_278.c3 = paVar21->c3;
          local_278.c4 = paVar21->c4;
          local_278.d1 = paVar21->d1;
          local_278.d2 = paVar21->d2;
          local_278.d3 = paVar21->d3;
          local_278.d4 = paVar21->d4;
        }
        paVar22 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar22);
        local_658._0_8_ = paVar22;
        NameTransformationChainNode
                  ((string *)local_5f0,(FBXConverter *)iVar30._M_current,name,
                   (TransformationComp)uVar35);
        uVar26 = local_5f0._8_8_;
        uVar25 = local_5f0._0_8_;
        if ((ulong)local_5f0._8_8_ < 0x400) {
          (paVar22->mName).length = (ai_uint32)local_5f0._8_8_;
          memcpy((paVar22->mName).data,(void *)local_5f0._0_8_,local_5f0._8_8_);
          (paVar22->mName).data[uVar26] = '\0';
        }
        if ((FBXConverter *)uVar25 != (FBXConverter *)(local_5f0 + 0x10)) {
          operator_delete((void *)uVar25);
        }
        uVar27 = *puVar32;
        uVar28 = puVar32[1];
        uVar25 = puVar32[2];
        uVar26 = puVar32[3];
        uVar14 = puVar32[4];
        uVar15 = puVar32[5];
        uVar16 = puVar32[7];
        *(undefined8 *)(local_658._0_8_ + 0x434) = puVar32[6];
        *(undefined8 *)(local_658._0_8_ + 0x43c) = uVar16;
        *(undefined8 *)(local_658._0_8_ + 0x424) = uVar14;
        *(undefined8 *)(local_658._0_8_ + 0x42c) = uVar15;
        *(undefined8 *)(local_658._0_8_ + 0x414) = uVar25;
        *(undefined8 *)(local_658._0_8_ + 0x41c) = uVar26;
        ((aiMatrix4x4 *)(local_658._0_8_ + 0x404))->a1 = (float)(int)uVar27;
        ((aiMatrix4x4 *)(local_658._0_8_ + 0x404))->a2 = (float)(int)((ulong)uVar27 >> 0x20);
        *(undefined8 *)(local_658._0_8_ + 0x40c) = uVar28;
        this_01 = (vector<aiNode*,std::allocator<aiNode*>> *)output_nodes;
        if (uVar35 < 3) {
          this_01 = local_638;
        }
        iVar30._M_current = *(aiNode ***)(this_01 + 8);
        if (iVar30._M_current == *(aiNode ***)(this_01 + 0x10)) {
          std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                    (this_01,iVar30,(aiNode **)local_658);
        }
        else {
          *iVar30._M_current = (aiNode *)local_658._0_8_;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
      }
      uVar35 = uVar35 + 1;
      _Var29 = _Var29 * 2;
      puVar32 = puVar32 + 8;
    } while (uVar35 != 0x11);
    bVar17 = true;
    if ((output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (output_nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      __assert_fail("output_nodes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0x350,
                    "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                   );
    }
  }
  return bVar17;
}

Assistant:

bool FBXConverter::GenerateTransformationNodeChain(const Model& model, const std::string& name, std::vector<aiNode*>& output_nodes,
            std::vector<aiNode*>& post_output_nodes) {
            const PropertyTable& props = model.Props();
            const Model::RotOrder rot = model.RotationOrder();

            bool ok;

            aiMatrix4x4 chain[TransformationComp_MAXIMUM];

            ai_assert(TransformationComp_MAXIMUM < 32);
            std::uint32_t chainBits = 0;
            // A node won't need a node chain if it only has these.
            const std::uint32_t chainMaskSimple = (1 << TransformationComp_Translation) + (1 << TransformationComp_Scaling) + (1 << TransformationComp_Rotation);
            // A node will need a node chain if it has any of these.
            const std::uint32_t chainMaskComplex = ((1 << (TransformationComp_MAXIMUM)) - 1) - chainMaskSimple;

            std::fill_n(chain, static_cast<unsigned int>(TransformationComp_MAXIMUM), aiMatrix4x4());

            // generate transformation matrices for all the different transformation components
            const float zero_epsilon = Math::getEpsilon<float>();
            const aiVector3D all_ones(1.0f, 1.0f, 1.0f);

            const aiVector3D& PreRotation = PropertyGet<aiVector3D>(props, "PreRotation", ok);
            if (ok && PreRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PreRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PreRotation, chain[TransformationComp_PreRotation]);
            }

            const aiVector3D& PostRotation = PropertyGet<aiVector3D>(props, "PostRotation", ok);
            if (ok && PostRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PostRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PostRotation, chain[TransformationComp_PostRotation]);
            }

            const aiVector3D& RotationPivot = PropertyGet<aiVector3D>(props, "RotationPivot", ok);
            if (ok && RotationPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationPivot) | (1 << TransformationComp_RotationPivotInverse);

                aiMatrix4x4::Translation(RotationPivot, chain[TransformationComp_RotationPivot]);
                aiMatrix4x4::Translation(-RotationPivot, chain[TransformationComp_RotationPivotInverse]);
            }

            const aiVector3D& RotationOffset = PropertyGet<aiVector3D>(props, "RotationOffset", ok);
            if (ok && RotationOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationOffset);

                aiMatrix4x4::Translation(RotationOffset, chain[TransformationComp_RotationOffset]);
            }

            const aiVector3D& ScalingOffset = PropertyGet<aiVector3D>(props, "ScalingOffset", ok);
            if (ok && ScalingOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingOffset);

                aiMatrix4x4::Translation(ScalingOffset, chain[TransformationComp_ScalingOffset]);
            }

            const aiVector3D& ScalingPivot = PropertyGet<aiVector3D>(props, "ScalingPivot", ok);
            if (ok && ScalingPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingPivot) | (1 << TransformationComp_ScalingPivotInverse);

                aiMatrix4x4::Translation(ScalingPivot, chain[TransformationComp_ScalingPivot]);
                aiMatrix4x4::Translation(-ScalingPivot, chain[TransformationComp_ScalingPivotInverse]);
            }

            const aiVector3D& Translation = PropertyGet<aiVector3D>(props, "Lcl Translation", ok);
            if (ok && Translation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Translation);

                aiMatrix4x4::Translation(Translation, chain[TransformationComp_Translation]);
            }

            const aiVector3D& Scaling = PropertyGet<aiVector3D>(props, "Lcl Scaling", ok);
            if (ok && (Scaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Scaling);

                aiMatrix4x4::Scaling(Scaling, chain[TransformationComp_Scaling]);
            }

            const aiVector3D& Rotation = PropertyGet<aiVector3D>(props, "Lcl Rotation", ok);
            if (ok && Rotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Rotation);

                GetRotationMatrix(rot, Rotation, chain[TransformationComp_Rotation]);
            }

            const aiVector3D& GeometricScaling = PropertyGet<aiVector3D>(props, "GeometricScaling", ok);
            if (ok && (GeometricScaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricScaling);
                aiMatrix4x4::Scaling(GeometricScaling, chain[TransformationComp_GeometricScaling]);
                aiVector3D GeometricScalingInverse = GeometricScaling;
                bool canscale = true;
                for (unsigned int i = 0; i < 3; ++i) {
                    if (std::fabs(GeometricScalingInverse[i]) > zero_epsilon) {
                        GeometricScalingInverse[i] = 1.0f / GeometricScaling[i];
                    }
                    else {
                        FBXImporter::LogError("cannot invert geometric scaling matrix with a 0.0 scale component");
                        canscale = false;
                        break;
                    }
                }
                if (canscale) {
                    chainBits = chainBits | (1 << TransformationComp_GeometricScalingInverse);
                    aiMatrix4x4::Scaling(GeometricScalingInverse, chain[TransformationComp_GeometricScalingInverse]);
                }
            }

            const aiVector3D& GeometricRotation = PropertyGet<aiVector3D>(props, "GeometricRotation", ok);
            if (ok && GeometricRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricRotation) | (1 << TransformationComp_GeometricRotationInverse);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotation]);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotationInverse]);
                chain[TransformationComp_GeometricRotationInverse].Inverse();
            }

            const aiVector3D& GeometricTranslation = PropertyGet<aiVector3D>(props, "GeometricTranslation", ok);
            if (ok && GeometricTranslation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricTranslation) | (1 << TransformationComp_GeometricTranslationInverse);
                aiMatrix4x4::Translation(GeometricTranslation, chain[TransformationComp_GeometricTranslation]);
                aiMatrix4x4::Translation(-GeometricTranslation, chain[TransformationComp_GeometricTranslationInverse]);
            }

            // is_complex needs to be consistent with NeedsComplexTransformationChain()
            // or the interplay between this code and the animation converter would
            // not be guaranteed.
            ai_assert(NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0));

            // now, if we have more than just Translation, Scaling and Rotation,
            // we need to generate a full node chain to accommodate for assimp's
            // lack to express pivots and offsets.
            if ((chainBits & chainMaskComplex) && doc.Settings().preservePivots) {
                FBXImporter::LogInfo("generating full transformation chain for node: " + name);

                // query the anim_chain_bits dictionary to find out which chain elements
                // have associated node animation channels. These can not be dropped
                // even if they have identity transform in bind pose.
                NodeAnimBitMap::const_iterator it = node_anim_chain_bits.find(name);
                const unsigned int anim_chain_bitmask = (it == node_anim_chain_bits.end() ? 0 : (*it).second);

                unsigned int bit = 0x1;
                for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                    const TransformationComp comp = static_cast<TransformationComp>(i);

                    if ((chainBits & bit) == 0 && (anim_chain_bitmask & bit) == 0) {
                        continue;
                    }

                    if (comp == TransformationComp_PostRotation) {
                        chain[i] = chain[i].Inverse();
                    }

                    aiNode* nd = new aiNode();
                    nd->mName.Set(NameTransformationChainNode(name, comp));
                    nd->mTransformation = chain[i];

                    // geometric inverses go in a post-node chain
                    if (comp == TransformationComp_GeometricScalingInverse ||
                        comp == TransformationComp_GeometricRotationInverse ||
                        comp == TransformationComp_GeometricTranslationInverse
                        ) {
                        post_output_nodes.push_back(nd);
                    }
                    else {
                        output_nodes.push_back(nd);
                    }
                }

                ai_assert(output_nodes.size());
                return true;
            }

            // else, we can just multiply the matrices together
            aiNode* nd = new aiNode();
            output_nodes.push_back(nd);

            // name passed to the method is already unique
            nd->mName.Set(name);

            for (const auto &transform : chain) {
                nd->mTransformation = nd->mTransformation * transform;
            }
            return false;
        }